

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  __m128i *palVar13;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *palVar14;
  __m128i *palVar15;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int16_t *ptr_03;
  int16_t iVar16;
  uint uVar17;
  undefined4 in_register_0000000c;
  undefined8 uVar18;
  size_t len;
  __m128i *ptr_04;
  char *pcVar19;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar20;
  long lVar21;
  char *__format;
  int iVar22;
  ulong uVar23;
  __m128i *ptr_05;
  int iVar24;
  int32_t seglen;
  long lVar25;
  __m128i *ptr_06;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  undefined4 uVar32;
  undefined4 uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i alVar38;
  __m128i alVar39;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i alVar51;
  __m128i alVar52;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i alVar63;
  __m128i alVar64;
  ushort uVar65;
  ulong uVar66;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar67 [16];
  __m128i alVar68;
  __m128i alVar69;
  undefined1 auVar77 [16];
  short sVar78;
  undefined1 auVar79 [16];
  short sVar80;
  short sVar85;
  ulong uVar81;
  short sVar83;
  short sVar84;
  short sVar86;
  short sVar87;
  short sVar88;
  undefined1 auVar82 [16];
  short sVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ulong uVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar107;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  undefined1 auVar108 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_128 [16];
  short local_b8;
  short sStack_b6;
  ushort local_78;
  ushort uStack_76;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong extraout_RDX_00;
  short sVar31;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  
  uVar18 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            uVar20 = uVar17 - 1;
            uVar28 = (ulong)uVar17 + 7 >> 3;
            uVar34 = (ulong)uVar20 % uVar28;
            iVar30 = -open;
            iVar22 = ppVar4->min;
            iVar24 = -iVar22;
            if (iVar22 != iVar30 && SBORROW4(iVar22,iVar30) == iVar22 + open < 0) {
              iVar24 = open;
            }
            pvVar5 = (profile->profile16).matches;
            iVar22 = ppVar4->max;
            pvVar6 = (profile->profile16).similar;
            ppVar12 = parasail_result_new_rowcol3((uint)((ulong)uVar17 + 7) & 0x7ffffff8,s2Len);
            if (ppVar12 != (parasail_result_t *)0x0) {
              ppVar12->flag = ppVar12->flag | 0x8250801;
              ptr = parasail_memalign___m128i(0x10,uVar28);
              palVar13 = parasail_memalign___m128i(0x10,uVar28);
              b = parasail_memalign___m128i(0x10,uVar28);
              ptr_00 = parasail_memalign___m128i(0x10,uVar28);
              b_00 = parasail_memalign___m128i(0x10,uVar28);
              palVar14 = parasail_memalign___m128i(0x10,uVar28);
              palVar15 = parasail_memalign___m128i(0x10,uVar28);
              ptr_01 = parasail_memalign___m128i(0x10,uVar28);
              ptr_02 = parasail_memalign___m128i(0x10,uVar28);
              b_01 = parasail_memalign___m128i(0x10,uVar28);
              b_02 = parasail_memalign___m128i(0x10,uVar28);
              b_03 = parasail_memalign___m128i(0x10,uVar28);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              len = CONCAT71((int7)((ulong)uVar18 >> 8),ptr_02 == (__m128i *)0x0);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = b_02 == (__m128i *)0x0;
              auVar35._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar35._8_8_ = -(ulong)(palVar13 == (__m128i *)0x0);
              auVar58._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar58._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
              auVar35 = packssdw(auVar35,auVar58);
              auVar82._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar82._8_8_ = -(ulong)(palVar14 == (__m128i *)0x0);
              auVar103._0_8_ = -(ulong)(palVar15 == (__m128i *)0x0);
              auVar103._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
              auVar58 = packssdw(auVar82,auVar103);
              auVar35 = packssdw(auVar35,auVar58);
              if (((((b_01 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                   && b_03 != (__m128i *)0x0) && ptr_03 != (int16_t *)0x0) &&
                  ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar35 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar35 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar35 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar35 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar35 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar35 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar35 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar35 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar35[0xf])) {
                iVar10 = s2Len + -1;
                iVar11 = 7 - (int)(uVar20 / uVar28);
                auVar35 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar32 = auVar35._0_4_;
                auVar35 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar33 = auVar35._0_4_;
                auVar35 = pshuflw(ZEXT416(iVar24 - 0x7fff),ZEXT416(iVar24 - 0x7fff),0);
                local_b8 = auVar35._0_2_;
                sStack_b6 = auVar35._2_2_;
                auVar58 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar5 >> 0x10),
                                                 0x7ffe - (short)iVar22));
                auVar58 = pshuflw(auVar58,auVar58,0);
                c[0] = uVar28;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar28;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar28;
                parasail_memset___m128i(palVar15,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar28;
                parasail_memset___m128i(b_01,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar28;
                parasail_memset___m128i(b_02,c_03,len);
                pmovsxbw(extraout_XMM0,0x101010101010101);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar28;
                parasail_memset___m128i(b_03,c_04,len);
                lVar21 = (long)iVar30;
                for (uVar23 = 0; uVar23 != uVar28; uVar23 = uVar23 + 1) {
                  lVar25 = lVar21;
                  for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
                    lVar29 = -0x8000;
                    if (-0x8000 < lVar25) {
                      lVar29 = lVar25;
                    }
                    lVar27 = lVar25 - (ulong)(uint)open;
                    if (lVar27 < -0x7fff) {
                      lVar27 = -0x8000;
                    }
                    *(short *)((long)&h + lVar26 * 2) = (short)lVar29;
                    *(short *)((long)&e + lVar26 * 2) = (short)lVar27;
                    lVar25 = lVar25 - uVar28 * (uint)gap;
                  }
                  ptr[uVar23][0] = h.m[0];
                  ptr[uVar23][1] = h.m[1];
                  ptr_02[uVar23][0] = e.m[0];
                  ptr_02[uVar23][1] = e.m[1];
                  lVar21 = lVar21 - (ulong)(uint)gap;
                }
                *ptr_03 = 0;
                for (uVar23 = 1; s2Len + 1 != uVar23; uVar23 = uVar23 + 1) {
                  iVar16 = -0x8000;
                  if (-0x8000 < iVar30) {
                    iVar16 = (int16_t)iVar30;
                  }
                  ptr_03[uVar23] = iVar16;
                  iVar30 = iVar30 - gap;
                }
                uVar17 = (int)uVar28 - 1;
                uVar23 = 0;
                local_78 = auVar58._0_2_;
                uStack_76 = auVar58._2_2_;
                local_158._4_2_ = local_b8;
                local_158._0_4_ = auVar35._0_4_;
                local_158._6_2_ = sStack_b6;
                local_158._8_2_ = local_b8;
                local_158._10_2_ = sStack_b6;
                local_158._12_2_ = local_b8;
                local_158._14_2_ = sStack_b6;
                uVar90 = local_78;
                uVar91 = uStack_76;
                uVar92 = local_78;
                uVar93 = uStack_76;
                uVar94 = local_78;
                uVar95 = uStack_76;
                uVar96 = local_78;
                uVar97 = uStack_76;
                do {
                  ptr_06 = palVar15;
                  ptr_05 = b;
                  palVar15 = palVar14;
                  ptr_04 = palVar13;
                  if (uVar23 == (uint)s2Len) {
                    palVar13 = ptr_04;
                    for (uVar23 = 0; uVar28 != uVar23; uVar23 = uVar23 + 1) {
                      vH[0] = uVar23 & 0xffffffff;
                      vH[1] = uVar28;
                      palVar14 = b_00;
                      arr_store_col(*(int **)((long)((ppVar12->field_4).trace)->trace_del_table +
                                             0x20),vH,(int32_t)palVar13,(int32_t)b_00);
                      vH_00[0] = uVar23 & 0xffffffff;
                      vH_00[1] = uVar28;
                      seglen = (int32_t)palVar14;
                      arr_store_col(*(int **)((long)((ppVar12->field_4).trace)->trace_del_table +
                                             0x28),vH_00,(int32_t)palVar13,seglen);
                      vH_01[0] = uVar23 & 0xffffffff;
                      vH_01[1] = uVar28;
                      arr_store_col(*(int **)((long)((ppVar12->field_4).trace)->trace_del_table +
                                             0x30),vH_01,(int32_t)palVar13,seglen);
                      vH_02[0] = uVar23 & 0xffffffff;
                      vH_02[1] = uVar28;
                      arr_store_col(*(int **)((long)((ppVar12->field_4).trace)->trace_del_table +
                                             0x38),vH_02,(int32_t)palVar13,seglen);
                    }
                    alVar69 = ptr[uVar34];
                    alVar64 = ptr_05[uVar34];
                    alVar52 = b_00[uVar34];
                    alVar39 = ptr_06[uVar34];
                    iVar22 = 0;
                    while( true ) {
                      uVar81 = alVar69[0];
                      lVar29 = alVar69[1];
                      uVar23 = alVar64[0];
                      lVar26 = alVar64[1];
                      uVar28 = alVar52[0];
                      lVar25 = alVar52[1];
                      uVar34 = alVar39[0];
                      lVar21 = alVar39[1];
                      if (iVar11 <= iVar22) break;
                      alVar69[0] = uVar81 << 0x10;
                      alVar69[1] = lVar29 << 0x10 | uVar81 >> 0x30;
                      alVar64[0] = uVar23 << 0x10;
                      alVar64[1] = lVar26 << 0x10 | uVar23 >> 0x30;
                      alVar52[0] = uVar28 << 0x10;
                      alVar52[1] = lVar25 << 0x10 | uVar28 >> 0x30;
                      alVar39[0] = uVar34 << 0x10;
                      alVar39[1] = lVar21 << 0x10 | uVar34 >> 0x30;
                      iVar22 = iVar22 + 1;
                    }
                    auVar77._0_2_ = -(ushort)((short)uVar90 < local_b8);
                    auVar77._2_2_ = -(ushort)((short)uVar91 < sStack_b6);
                    auVar77._4_2_ = -(ushort)((short)uVar92 < local_b8);
                    auVar77._6_2_ = -(ushort)((short)uVar93 < sStack_b6);
                    auVar77._8_2_ = -(ushort)((short)uVar94 < local_b8);
                    auVar77._10_2_ = -(ushort)((short)uVar95 < sStack_b6);
                    auVar77._12_2_ = -(ushort)((short)uVar96 < local_b8);
                    auVar77._14_2_ = -(ushort)((short)uVar97 < sStack_b6);
                    auVar79._0_2_ = -(ushort)((short)local_78 < local_158._0_2_);
                    auVar79._2_2_ = -(ushort)((short)uStack_76 < local_158._2_2_);
                    auVar79._4_2_ = -(ushort)((short)local_78 < local_158._4_2_);
                    auVar79._6_2_ = -(ushort)((short)uStack_76 < local_158._6_2_);
                    auVar79._8_2_ = -(ushort)((short)local_78 < local_158._8_2_);
                    auVar79._10_2_ = -(ushort)((short)uStack_76 < local_158._10_2_);
                    auVar79._12_2_ = -(ushort)((short)local_78 < local_158._12_2_);
                    auVar79._14_2_ = -(ushort)((short)uStack_76 < local_158._14_2_);
                    auVar79 = auVar79 | auVar77;
                    if ((((((((((((((((auVar79 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar79 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar79 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar79 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar79 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar79 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar79 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar79 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar79 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar79 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar79 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar79 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar79 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar79[0xf]) {
                      sVar78 = alVar69[1]._6_2_;
                      sVar31 = alVar64[1]._6_2_;
                      sVar40 = alVar52[1]._6_2_;
                      sVar41 = alVar39[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                      sVar78 = 0;
                      sVar31 = 0;
                      sVar40 = 0;
                      sVar41 = 0;
                      iVar10 = 0;
                      uVar20 = 0;
                    }
                    ppVar12->score = (int)sVar78;
                    ppVar12->end_query = uVar20;
                    ppVar12->end_ref = iVar10;
                    *(int *)(ppVar12->field_4).extra = (int)sVar31;
                    ((ppVar12->field_4).stats)->similar = (int)sVar40;
                    ((ppVar12->field_4).stats)->length = (int)sVar41;
                    parasail_free(ptr_03);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(ptr_06);
                    parasail_free(palVar15);
                    parasail_free(b_00);
                    parasail_free(ptr_00);
                    parasail_free(ptr_05);
                    parasail_free(ptr_04);
                    parasail_free(ptr);
                    return ppVar12;
                  }
                  uVar81 = ptr[uVar17][0];
                  uVar102 = ptr_05[uVar17][0];
                  uVar57 = b_00[uVar17][0];
                  uVar66 = ptr_06[uVar17][0];
                  auVar104._0_8_ = uVar102 << 0x10;
                  auVar104._8_8_ = ptr_05[uVar17][1] << 0x10 | uVar102 >> 0x30;
                  auVar105._0_8_ = uVar57 << 0x10;
                  auVar105._8_8_ = b_00[uVar17][1] << 0x10 | uVar57 >> 0x30;
                  auVar106._0_8_ = uVar66 << 0x10;
                  auVar106._8_8_ = ptr_06[uVar17][1] << 0x10 | uVar66 >> 0x30;
                  auVar47._8_8_ = ptr[uVar17][1] << 0x10 | uVar81 >> 0x30;
                  auVar47._0_8_ = uVar81 << 0x10 | (ulong)(ushort)ptr_03[uVar23];
                  lVar25 = (long)(ppVar4->mapper[(byte)s2[uVar23]] * (int)uVar28) * 0x10;
                  local_168 = (undefined1  [16])0x0;
                  auVar108._4_2_ = local_b8;
                  auVar108._0_4_ = auVar35._0_4_;
                  auVar108._6_2_ = sStack_b6;
                  auVar108._8_2_ = local_b8;
                  auVar108._10_2_ = sStack_b6;
                  auVar108._12_2_ = local_b8;
                  auVar108._14_2_ = sStack_b6;
                  local_178 = (undefined1  [16])0x0;
                  local_128._8_8_ = 0x1000100010001;
                  local_128._0_8_ = 0x1000100010001;
                  auVar58 = local_158;
                  for (lVar21 = 0; uVar28 << 4 != lVar21; lVar21 = lVar21 + 0x10) {
                    auVar82 = *(undefined1 (*) [16])((long)*ptr_02 + lVar21);
                    auVar103 = *(undefined1 (*) [16])((long)*b_01 + lVar21);
                    auVar60 = *(undefined1 (*) [16])((long)*b_02 + lVar21);
                    auVar61 = *(undefined1 (*) [16])((long)*b_03 + lVar21);
                    auVar47 = paddsw(auVar47,*(undefined1 (*) [16])((long)pvVar3 + lVar21 + lVar25))
                    ;
                    sVar78 = auVar82._0_2_;
                    uVar53 = auVar47._0_2_;
                    uVar65 = (ushort)((short)uVar53 < sVar78) * sVar78 |
                             ((short)uVar53 >= sVar78) * uVar53;
                    sVar78 = auVar82._2_2_;
                    uVar54 = auVar47._2_2_;
                    uVar70 = (ushort)((short)uVar54 < sVar78) * sVar78 |
                             ((short)uVar54 >= sVar78) * uVar54;
                    sVar78 = auVar82._4_2_;
                    uVar55 = auVar47._4_2_;
                    uVar71 = (ushort)((short)uVar55 < sVar78) * sVar78 |
                             ((short)uVar55 >= sVar78) * uVar55;
                    sVar78 = auVar82._6_2_;
                    uVar56 = auVar47._6_2_;
                    uVar72 = (ushort)((short)uVar56 < sVar78) * sVar78 |
                             ((short)uVar56 >= sVar78) * uVar56;
                    sVar78 = auVar82._8_2_;
                    uVar98 = auVar47._8_2_;
                    uVar73 = (ushort)((short)uVar98 < sVar78) * sVar78 |
                             ((short)uVar98 >= sVar78) * uVar98;
                    sVar78 = auVar82._10_2_;
                    uVar99 = auVar47._10_2_;
                    uVar74 = (ushort)((short)uVar99 < sVar78) * sVar78 |
                             ((short)uVar99 >= sVar78) * uVar99;
                    sVar78 = auVar82._12_2_;
                    uVar100 = auVar47._12_2_;
                    uVar101 = auVar47._14_2_;
                    uVar75 = (ushort)((short)uVar100 < sVar78) * sVar78 |
                             ((short)uVar100 >= sVar78) * uVar100;
                    sVar78 = auVar82._14_2_;
                    uVar76 = (ushort)((short)uVar101 < sVar78) * sVar78 |
                             ((short)uVar101 >= sVar78) * uVar101;
                    sVar78 = auVar108._0_2_;
                    auVar59._0_2_ =
                         (ushort)((short)uVar65 < sVar78) * sVar78 |
                         ((short)uVar65 >= sVar78) * uVar65;
                    sVar31 = auVar108._2_2_;
                    auVar59._2_2_ =
                         (ushort)((short)uVar70 < sVar31) * sVar31 |
                         ((short)uVar70 >= sVar31) * uVar70;
                    sVar40 = auVar108._4_2_;
                    auVar59._4_2_ =
                         (ushort)((short)uVar71 < sVar40) * sVar40 |
                         ((short)uVar71 >= sVar40) * uVar71;
                    sVar41 = auVar108._6_2_;
                    auVar59._6_2_ =
                         (ushort)((short)uVar72 < sVar41) * sVar41 |
                         ((short)uVar72 >= sVar41) * uVar72;
                    sVar42 = auVar108._8_2_;
                    auVar59._8_2_ =
                         (ushort)((short)uVar73 < sVar42) * sVar42 |
                         ((short)uVar73 >= sVar42) * uVar73;
                    sVar43 = auVar108._10_2_;
                    auVar59._10_2_ =
                         (ushort)((short)uVar74 < sVar43) * sVar43 |
                         ((short)uVar74 >= sVar43) * uVar74;
                    sVar44 = auVar108._12_2_;
                    auVar59._12_2_ =
                         (ushort)((short)uVar75 < sVar44) * sVar44 |
                         ((short)uVar75 >= sVar44) * uVar75;
                    sVar45 = auVar108._14_2_;
                    auVar59._14_2_ =
                         (ushort)((short)uVar76 < sVar45) * sVar45 |
                         ((short)uVar76 >= sVar45) * uVar76;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar21) = auVar59;
                    auVar67._0_2_ = -(ushort)(sVar78 < (short)uVar65);
                    auVar67._2_2_ = -(ushort)(sVar31 < (short)uVar70);
                    auVar67._4_2_ = -(ushort)(sVar40 < (short)uVar71);
                    auVar67._6_2_ = -(ushort)(sVar41 < (short)uVar72);
                    auVar67._8_2_ = -(ushort)(sVar42 < (short)uVar73);
                    auVar67._10_2_ = -(ushort)(sVar43 < (short)uVar74);
                    auVar67._12_2_ = -(ushort)(sVar44 < (short)uVar75);
                    auVar67._14_2_ = -(ushort)(sVar45 < (short)uVar76);
                    auVar116 = pblendvb(local_168,auVar103,auVar67);
                    auVar47 = paddsw(auVar104,*(undefined1 (*) [16])((long)pvVar5 + lVar21 + lVar25)
                                    );
                    auVar48._0_2_ = -(ushort)(uVar53 == auVar59._0_2_);
                    auVar48._2_2_ = -(ushort)(uVar54 == auVar59._2_2_);
                    auVar48._4_2_ = -(ushort)(uVar55 == auVar59._4_2_);
                    auVar48._6_2_ = -(ushort)(uVar56 == auVar59._6_2_);
                    auVar48._8_2_ = -(ushort)(uVar98 == auVar59._8_2_);
                    auVar48._10_2_ = -(ushort)(uVar99 == auVar59._10_2_);
                    auVar48._12_2_ = -(ushort)(uVar100 == auVar59._12_2_);
                    auVar48._14_2_ = -(ushort)(uVar101 == auVar59._14_2_);
                    auVar117 = pblendvb(auVar116,auVar47,auVar48);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar21) = auVar117;
                    auVar104 = pblendvb(local_178,auVar60,auVar67);
                    auVar47 = paddsw(auVar105,*(undefined1 (*) [16])((long)pvVar6 + lVar21 + lVar25)
                                    );
                    auVar105 = pblendvb(auVar104,auVar47,auVar48);
                    *(undefined1 (*) [16])((long)*palVar15 + lVar21) = auVar105;
                    auVar104 = pblendvb(local_128,auVar61,auVar67);
                    auVar47 = pmovsxbw(auVar58,0x101010101010101);
                    auVar58 = paddsw(auVar106,auVar47);
                    auVar104 = pblendvb(auVar104,auVar58,auVar48);
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar21) = auVar104;
                    uVar90 = ((short)auVar59._0_2_ < (short)uVar90) * auVar59._0_2_ |
                             ((short)auVar59._0_2_ >= (short)uVar90) * uVar90;
                    uVar91 = ((short)auVar59._2_2_ < (short)uVar91) * auVar59._2_2_ |
                             ((short)auVar59._2_2_ >= (short)uVar91) * uVar91;
                    uVar92 = ((short)auVar59._4_2_ < (short)uVar92) * auVar59._4_2_ |
                             ((short)auVar59._4_2_ >= (short)uVar92) * uVar92;
                    uVar93 = ((short)auVar59._6_2_ < (short)uVar93) * auVar59._6_2_ |
                             ((short)auVar59._6_2_ >= (short)uVar93) * uVar93;
                    uVar94 = ((short)auVar59._8_2_ < (short)uVar94) * auVar59._8_2_ |
                             ((short)auVar59._8_2_ >= (short)uVar94) * uVar94;
                    uVar95 = ((short)auVar59._10_2_ < (short)uVar95) * auVar59._10_2_ |
                             ((short)auVar59._10_2_ >= (short)uVar95) * uVar95;
                    uVar96 = ((short)auVar59._12_2_ < (short)uVar96) * auVar59._12_2_ |
                             ((short)auVar59._12_2_ >= (short)uVar96) * uVar96;
                    uVar97 = ((short)auVar59._14_2_ < (short)uVar97) * auVar59._14_2_ |
                             ((short)auVar59._14_2_ >= (short)uVar97) * uVar97;
                    uVar98 = ((short)local_158._0_2_ < (short)auVar59._0_2_) * auVar59._0_2_ |
                             (ushort)((short)local_158._0_2_ >= (short)auVar59._0_2_) *
                             local_158._0_2_;
                    uVar73 = ((short)local_158._2_2_ < (short)auVar59._2_2_) * auVar59._2_2_ |
                             (ushort)((short)local_158._2_2_ >= (short)auVar59._2_2_) *
                             local_158._2_2_;
                    uVar74 = ((short)local_158._4_2_ < (short)auVar59._4_2_) * auVar59._4_2_ |
                             (ushort)((short)local_158._4_2_ >= (short)auVar59._4_2_) *
                             local_158._4_2_;
                    uVar99 = ((short)local_158._6_2_ < (short)auVar59._6_2_) * auVar59._6_2_ |
                             (ushort)((short)local_158._6_2_ >= (short)auVar59._6_2_) *
                             local_158._6_2_;
                    uVar75 = ((short)local_158._8_2_ < (short)auVar59._8_2_) * auVar59._8_2_ |
                             (ushort)((short)local_158._8_2_ >= (short)auVar59._8_2_) *
                             local_158._8_2_;
                    uVar100 = ((short)local_158._10_2_ < (short)auVar59._10_2_) * auVar59._10_2_ |
                              (ushort)((short)local_158._10_2_ >= (short)auVar59._10_2_) *
                              local_158._10_2_;
                    uVar76 = ((short)local_158._12_2_ < (short)auVar59._12_2_) * auVar59._12_2_ |
                             (ushort)((short)local_158._12_2_ >= (short)auVar59._12_2_) *
                             local_158._12_2_;
                    uVar101 = ((short)local_158._14_2_ < (short)auVar59._14_2_) * auVar59._14_2_ |
                              (ushort)((short)local_158._14_2_ >= (short)auVar59._14_2_) *
                              local_158._14_2_;
                    sVar78 = auVar104._0_2_;
                    sVar31 = auVar105._0_2_;
                    uVar65 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._2_2_;
                    sVar31 = auVar105._2_2_;
                    uVar53 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._4_2_;
                    sVar31 = auVar105._4_2_;
                    uVar70 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._6_2_;
                    sVar31 = auVar105._6_2_;
                    uVar54 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._8_2_;
                    sVar31 = auVar105._8_2_;
                    uVar71 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._10_2_;
                    sVar31 = auVar105._10_2_;
                    uVar55 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._12_2_;
                    sVar31 = auVar105._12_2_;
                    sVar40 = auVar105._14_2_;
                    uVar56 = (ushort)(sVar31 < sVar78) * sVar78 |
                             (ushort)(sVar31 >= sVar78) * sVar31;
                    sVar78 = auVar104._14_2_;
                    uVar72 = (ushort)(sVar40 < sVar78) * sVar78 |
                             (ushort)(sVar40 >= sVar78) * sVar40;
                    auVar116._4_4_ = uVar32;
                    auVar116._0_4_ = uVar32;
                    auVar116._8_4_ = uVar32;
                    auVar116._12_4_ = uVar32;
                    auVar58 = psubsw(auVar59,auVar116);
                    auVar8._4_4_ = uVar33;
                    auVar8._0_4_ = uVar33;
                    auVar8._8_4_ = uVar33;
                    auVar8._12_4_ = uVar33;
                    auVar82 = psubsw(auVar82,auVar8);
                    sVar31 = auVar58._0_2_;
                    sVar80 = auVar82._0_2_;
                    auVar36._0_2_ = -(ushort)(sVar80 < sVar31);
                    sVar40 = auVar58._2_2_;
                    sVar83 = auVar82._2_2_;
                    auVar36._2_2_ = -(ushort)(sVar83 < sVar40);
                    sVar41 = auVar58._4_2_;
                    sVar84 = auVar82._4_2_;
                    auVar36._4_2_ = -(ushort)(sVar84 < sVar41);
                    sVar42 = auVar58._6_2_;
                    sVar85 = auVar82._6_2_;
                    auVar36._6_2_ = -(ushort)(sVar85 < sVar42);
                    sVar43 = auVar58._8_2_;
                    sVar86 = auVar82._8_2_;
                    auVar36._8_2_ = -(ushort)(sVar86 < sVar43);
                    sVar44 = auVar58._10_2_;
                    sVar87 = auVar82._10_2_;
                    auVar36._10_2_ = -(ushort)(sVar87 < sVar44);
                    sVar45 = auVar58._12_2_;
                    sVar88 = auVar82._12_2_;
                    sVar46 = auVar58._14_2_;
                    auVar36._12_2_ = -(ushort)(sVar88 < sVar45);
                    sVar89 = auVar82._14_2_;
                    auVar36._14_2_ = -(ushort)(sVar89 < sVar46);
                    auVar106 = pblendvb(auVar103,auVar117,auVar36);
                    auVar82 = pblendvb(auVar60,auVar105,auVar36);
                    auVar58 = paddsw(auVar61,auVar47);
                    auVar103 = paddsw(auVar104,auVar47);
                    auVar47 = pblendvb(auVar58,auVar103,auVar36);
                    auVar58 = psubsw(auVar108,auVar8);
                    sVar107 = auVar58._0_2_;
                    auVar60._0_2_ = -(ushort)(sVar107 < sVar31);
                    sVar109 = auVar58._2_2_;
                    auVar60._2_2_ = -(ushort)(sVar109 < sVar40);
                    sVar110 = auVar58._4_2_;
                    auVar60._4_2_ = -(ushort)(sVar110 < sVar41);
                    sVar111 = auVar58._6_2_;
                    auVar60._6_2_ = -(ushort)(sVar111 < sVar42);
                    sVar112 = auVar58._8_2_;
                    auVar60._8_2_ = -(ushort)(sVar112 < sVar43);
                    sVar113 = auVar58._10_2_;
                    auVar60._10_2_ = -(ushort)(sVar113 < sVar44);
                    sVar114 = auVar58._12_2_;
                    auVar60._12_2_ = -(ushort)(sVar114 < sVar45);
                    sVar115 = auVar58._14_2_;
                    auVar60._14_2_ = -(ushort)(sVar115 < sVar46);
                    auVar58 = pblendvb(local_168,auVar117,auVar60);
                    sVar78 = auVar117._0_2_;
                    uVar98 = (ushort)((short)uVar98 < sVar78) * sVar78 |
                             ((short)uVar98 >= sVar78) * uVar98;
                    sVar78 = auVar117._2_2_;
                    uVar73 = (ushort)((short)uVar73 < sVar78) * sVar78 |
                             ((short)uVar73 >= sVar78) * uVar73;
                    sVar78 = auVar117._4_2_;
                    uVar74 = (ushort)((short)uVar74 < sVar78) * sVar78 |
                             ((short)uVar74 >= sVar78) * uVar74;
                    sVar78 = auVar117._6_2_;
                    uVar99 = (ushort)((short)uVar99 < sVar78) * sVar78 |
                             ((short)uVar99 >= sVar78) * uVar99;
                    sVar78 = auVar117._8_2_;
                    uVar75 = (ushort)((short)uVar75 < sVar78) * sVar78 |
                             ((short)uVar75 >= sVar78) * uVar75;
                    sVar78 = auVar117._10_2_;
                    uVar100 = (ushort)((short)uVar100 < sVar78) * sVar78 |
                              ((short)uVar100 >= sVar78) * uVar100;
                    sVar78 = auVar117._12_2_;
                    uVar76 = (ushort)((short)uVar76 < sVar78) * sVar78 |
                             ((short)uVar76 >= sVar78) * uVar76;
                    sVar78 = auVar117._14_2_;
                    uVar101 = (ushort)((short)uVar101 < sVar78) * sVar78 |
                              ((short)uVar101 >= sVar78) * uVar101;
                    local_158._2_2_ =
                         ((short)uVar73 < (short)uVar53) * uVar53 |
                         ((short)uVar73 >= (short)uVar53) * uVar73;
                    local_158._0_2_ =
                         ((short)uVar98 < (short)uVar65) * uVar65 |
                         ((short)uVar98 >= (short)uVar65) * uVar98;
                    local_158._4_2_ =
                         ((short)uVar74 < (short)uVar70) * uVar70 |
                         ((short)uVar74 >= (short)uVar70) * uVar74;
                    local_158._6_2_ =
                         ((short)uVar99 < (short)uVar54) * uVar54 |
                         ((short)uVar99 >= (short)uVar54) * uVar99;
                    local_158._8_2_ =
                         ((short)uVar75 < (short)uVar71) * uVar71 |
                         ((short)uVar75 >= (short)uVar71) * uVar75;
                    local_158._10_2_ =
                         ((short)uVar100 < (short)uVar55) * uVar55 |
                         ((short)uVar100 >= (short)uVar55) * uVar100;
                    local_158._12_2_ =
                         ((short)uVar76 < (short)uVar56) * uVar56 |
                         ((short)uVar76 >= (short)uVar56) * uVar76;
                    local_158._14_2_ =
                         ((short)uVar101 < (short)uVar72) * uVar72 |
                         ((short)uVar101 >= (short)uVar72) * uVar101;
                    puVar1 = (ushort *)((long)*ptr_02 + lVar21);
                    *puVar1 = (ushort)(sVar31 < sVar80) * sVar80 |
                              (ushort)(sVar31 >= sVar80) * sVar31;
                    puVar1[1] = (ushort)(sVar40 < sVar83) * sVar83 |
                                (ushort)(sVar40 >= sVar83) * sVar40;
                    puVar1[2] = (ushort)(sVar41 < sVar84) * sVar84 |
                                (ushort)(sVar41 >= sVar84) * sVar41;
                    puVar1[3] = (ushort)(sVar42 < sVar85) * sVar85 |
                                (ushort)(sVar42 >= sVar85) * sVar42;
                    puVar1[4] = (ushort)(sVar43 < sVar86) * sVar86 |
                                (ushort)(sVar43 >= sVar86) * sVar43;
                    puVar1[5] = (ushort)(sVar44 < sVar87) * sVar87 |
                                (ushort)(sVar44 >= sVar87) * sVar44;
                    puVar1[6] = (ushort)(sVar45 < sVar88) * sVar88 |
                                (ushort)(sVar45 >= sVar88) * sVar45;
                    puVar1[7] = (ushort)(sVar46 < sVar89) * sVar89 |
                                (ushort)(sVar46 >= sVar89) * sVar46;
                    *(undefined1 (*) [16])((long)*b_01 + lVar21) = auVar106;
                    *(undefined1 (*) [16])((long)*b_02 + lVar21) = auVar82;
                    *(undefined1 (*) [16])((long)*b_03 + lVar21) = auVar47;
                    auVar108._0_2_ =
                         (ushort)(sVar31 < sVar107) * sVar107 | (ushort)(sVar31 >= sVar107) * sVar31
                    ;
                    auVar108._2_2_ =
                         (ushort)(sVar40 < sVar109) * sVar109 | (ushort)(sVar40 >= sVar109) * sVar40
                    ;
                    auVar108._4_2_ =
                         (ushort)(sVar41 < sVar110) * sVar110 | (ushort)(sVar41 >= sVar110) * sVar41
                    ;
                    auVar108._6_2_ =
                         (ushort)(sVar42 < sVar111) * sVar111 | (ushort)(sVar42 >= sVar111) * sVar42
                    ;
                    auVar108._8_2_ =
                         (ushort)(sVar43 < sVar112) * sVar112 | (ushort)(sVar43 >= sVar112) * sVar43
                    ;
                    auVar108._10_2_ =
                         (ushort)(sVar44 < sVar113) * sVar113 | (ushort)(sVar44 >= sVar113) * sVar44
                    ;
                    auVar108._12_2_ =
                         (ushort)(sVar45 < sVar114) * sVar114 | (ushort)(sVar45 >= sVar114) * sVar45
                    ;
                    auVar108._14_2_ =
                         (ushort)(sVar46 < sVar115) * sVar115 | (ushort)(sVar46 >= sVar115) * sVar46
                    ;
                    local_178 = pblendvb(local_178,auVar105,auVar60);
                    auVar82 = paddsw(local_128,_DAT_008a1ba0);
                    local_128 = pblendvb(auVar82,auVar103,auVar60);
                    auVar47 = *(undefined1 (*) [16])((long)*ptr + lVar21);
                    auVar104 = *(undefined1 (*) [16])((long)*ptr_05 + lVar21);
                    auVar105 = *(undefined1 (*) [16])((long)*b_00 + lVar21);
                    auVar106 = *(undefined1 (*) [16])((long)*ptr_06 + lVar21);
                    local_168 = auVar58;
                  }
                  for (iVar22 = 0; iVar22 != 8; iVar22 = iVar22 + 1) {
                    uVar81 = ptr[uVar17][0];
                    uVar7 = ptr_03[uVar23 + 1] - open;
                    if (ptr_03[uVar23 + 1] - open < -0x7fff) {
                      uVar7 = 0xffff8000;
                    }
                    lVar21 = local_168._8_8_;
                    uVar102 = local_168._0_8_;
                    local_168._0_8_ = uVar102 << 0x10;
                    local_168._8_8_ = lVar21 << 0x10 | uVar102 >> 0x30;
                    auVar61._8_8_ = ptr[uVar17][1] << 0x10 | uVar81 >> 0x30;
                    auVar61._0_8_ = uVar81 << 0x10 | (ulong)(ushort)ptr_03[uVar23];
                    lVar21 = local_178._8_8_;
                    uVar81 = local_178._0_8_;
                    local_178._0_8_ = uVar81 << 0x10;
                    local_178._8_8_ = lVar21 << 0x10 | uVar81 >> 0x30;
                    uVar81 = auVar108._0_8_;
                    auVar108._8_8_ = auVar108._8_8_ << 0x10 | uVar81 >> 0x30;
                    auVar108._0_8_ = uVar81 << 0x10 | (ulong)uVar7 & 0xffff;
                    uVar81 = local_128._0_8_;
                    local_128._8_8_ = local_128._8_8_ << 0x10 | uVar81 >> 0x30;
                    local_128._0_8_ = uVar81 << 0x10 | 1;
                    for (lVar21 = 0; uVar28 << 4 != lVar21; lVar21 = lVar21 + 0x10) {
                      auVar58 = paddsw(auVar61,*(undefined1 (*) [16])
                                                ((long)pvVar3 + lVar21 + lVar25));
                      psVar2 = (short *)((long)*ptr_04 + lVar21);
                      sVar46 = *psVar2;
                      sVar80 = psVar2[1];
                      sVar83 = psVar2[2];
                      sVar84 = psVar2[3];
                      sVar85 = psVar2[4];
                      sVar86 = psVar2[5];
                      sVar87 = psVar2[6];
                      sVar88 = psVar2[7];
                      sVar78 = auVar108._0_2_;
                      auVar49._0_2_ =
                           (ushort)(sVar46 < sVar78) * sVar78 | (ushort)(sVar46 >= sVar78) * sVar46;
                      sVar31 = auVar108._2_2_;
                      auVar49._2_2_ =
                           (ushort)(sVar80 < sVar31) * sVar31 | (ushort)(sVar80 >= sVar31) * sVar80;
                      sVar40 = auVar108._4_2_;
                      auVar49._4_2_ =
                           (ushort)(sVar83 < sVar40) * sVar40 | (ushort)(sVar83 >= sVar40) * sVar83;
                      sVar41 = auVar108._6_2_;
                      auVar49._6_2_ =
                           (ushort)(sVar84 < sVar41) * sVar41 | (ushort)(sVar84 >= sVar41) * sVar84;
                      sVar42 = auVar108._8_2_;
                      auVar49._8_2_ =
                           (ushort)(sVar85 < sVar42) * sVar42 | (ushort)(sVar85 >= sVar42) * sVar85;
                      sVar43 = auVar108._10_2_;
                      auVar49._10_2_ =
                           (ushort)(sVar86 < sVar43) * sVar43 | (ushort)(sVar86 >= sVar43) * sVar86;
                      sVar44 = auVar108._12_2_;
                      auVar49._12_2_ =
                           (ushort)(sVar87 < sVar44) * sVar44 | (ushort)(sVar87 >= sVar44) * sVar87;
                      sVar45 = auVar108._14_2_;
                      auVar49._14_2_ =
                           (ushort)(sVar88 < sVar45) * sVar45 | (ushort)(sVar88 >= sVar45) * sVar88;
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar21) = auVar49;
                      auVar62._0_2_ = -(ushort)(auVar58._0_2_ == auVar49._0_2_);
                      auVar62._2_2_ = -(ushort)(auVar58._2_2_ == auVar49._2_2_);
                      auVar62._4_2_ = -(ushort)(auVar58._4_2_ == auVar49._4_2_);
                      auVar62._6_2_ = -(ushort)(auVar58._6_2_ == auVar49._6_2_);
                      auVar62._8_2_ = -(ushort)(auVar58._8_2_ == auVar49._8_2_);
                      auVar62._10_2_ = -(ushort)(auVar58._10_2_ == auVar49._10_2_);
                      auVar62._12_2_ = -(ushort)(auVar58._12_2_ == auVar49._12_2_);
                      auVar62._14_2_ = -(ushort)(auVar58._14_2_ == auVar49._14_2_);
                      auVar37._0_2_ = -(ushort)(sVar78 < sVar46);
                      auVar37._2_2_ = -(ushort)(sVar31 < sVar80);
                      auVar37._4_2_ = -(ushort)(sVar40 < sVar83);
                      auVar37._6_2_ = -(ushort)(sVar41 < sVar84);
                      auVar37._8_2_ = -(ushort)(sVar42 < sVar85);
                      auVar37._10_2_ = -(ushort)(sVar43 < sVar86);
                      auVar37._12_2_ = -(ushort)(sVar44 < sVar87);
                      auVar37._14_2_ = -(ushort)(sVar45 < sVar88);
                      auVar37 = auVar37 | auVar62;
                      auVar82 = pblendvb(local_168,*(undefined1 (*) [16])((long)*ptr_00 + lVar21),
                                         auVar37);
                      *(undefined1 (*) [16])((long)*ptr_00 + lVar21) = auVar82;
                      auVar47 = pblendvb(local_178,*(undefined1 (*) [16])((long)*palVar15 + lVar21),
                                         auVar37);
                      *(undefined1 (*) [16])((long)*palVar15 + lVar21) = auVar47;
                      auVar103 = pblendvb(local_128,*(undefined1 (*) [16])((long)*ptr_01 + lVar21),
                                          auVar37);
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar21) = auVar103;
                      uVar90 = ((short)auVar49._0_2_ < (short)uVar90) * auVar49._0_2_ |
                               ((short)auVar49._0_2_ >= (short)uVar90) * uVar90;
                      uVar91 = ((short)auVar49._2_2_ < (short)uVar91) * auVar49._2_2_ |
                               ((short)auVar49._2_2_ >= (short)uVar91) * uVar91;
                      uVar92 = ((short)auVar49._4_2_ < (short)uVar92) * auVar49._4_2_ |
                               ((short)auVar49._4_2_ >= (short)uVar92) * uVar92;
                      uVar93 = ((short)auVar49._6_2_ < (short)uVar93) * auVar49._6_2_ |
                               ((short)auVar49._6_2_ >= (short)uVar93) * uVar93;
                      uVar94 = ((short)auVar49._8_2_ < (short)uVar94) * auVar49._8_2_ |
                               ((short)auVar49._8_2_ >= (short)uVar94) * uVar94;
                      uVar95 = ((short)auVar49._10_2_ < (short)uVar95) * auVar49._10_2_ |
                               ((short)auVar49._10_2_ >= (short)uVar95) * uVar95;
                      uVar96 = ((short)auVar49._12_2_ < (short)uVar96) * auVar49._12_2_ |
                               ((short)auVar49._12_2_ >= (short)uVar96) * uVar96;
                      uVar97 = ((short)auVar49._14_2_ < (short)uVar97) * auVar49._14_2_ |
                               ((short)auVar49._14_2_ >= (short)uVar97) * uVar97;
                      sVar78 = local_158._0_2_;
                      uVar65 = (sVar78 < (short)auVar49._0_2_) * auVar49._0_2_ |
                               (ushort)(sVar78 >= (short)auVar49._0_2_) * sVar78;
                      sVar78 = local_158._2_2_;
                      uVar53 = (sVar78 < (short)auVar49._2_2_) * auVar49._2_2_ |
                               (ushort)(sVar78 >= (short)auVar49._2_2_) * sVar78;
                      sVar78 = local_158._4_2_;
                      uVar70 = (sVar78 < (short)auVar49._4_2_) * auVar49._4_2_ |
                               (ushort)(sVar78 >= (short)auVar49._4_2_) * sVar78;
                      sVar78 = local_158._6_2_;
                      uVar54 = (sVar78 < (short)auVar49._6_2_) * auVar49._6_2_ |
                               (ushort)(sVar78 >= (short)auVar49._6_2_) * sVar78;
                      sVar78 = local_158._8_2_;
                      uVar71 = (sVar78 < (short)auVar49._8_2_) * auVar49._8_2_ |
                               (ushort)(sVar78 >= (short)auVar49._8_2_) * sVar78;
                      sVar78 = local_158._10_2_;
                      uVar55 = (sVar78 < (short)auVar49._10_2_) * auVar49._10_2_ |
                               (ushort)(sVar78 >= (short)auVar49._10_2_) * sVar78;
                      sVar78 = local_158._12_2_;
                      sVar31 = local_158._14_2_;
                      uVar56 = (sVar78 < (short)auVar49._12_2_) * auVar49._12_2_ |
                               (ushort)(sVar78 >= (short)auVar49._12_2_) * sVar78;
                      uVar72 = (sVar31 < (short)auVar49._14_2_) * auVar49._14_2_ |
                               (ushort)(sVar31 >= (short)auVar49._14_2_) * sVar31;
                      sVar78 = auVar82._0_2_;
                      uVar65 = (ushort)((short)uVar65 < sVar78) * sVar78 |
                               ((short)uVar65 >= sVar78) * uVar65;
                      sVar78 = auVar82._2_2_;
                      uVar53 = (ushort)((short)uVar53 < sVar78) * sVar78 |
                               ((short)uVar53 >= sVar78) * uVar53;
                      sVar78 = auVar82._4_2_;
                      uVar70 = (ushort)((short)uVar70 < sVar78) * sVar78 |
                               ((short)uVar70 >= sVar78) * uVar70;
                      sVar78 = auVar82._6_2_;
                      uVar54 = (ushort)((short)uVar54 < sVar78) * sVar78 |
                               ((short)uVar54 >= sVar78) * uVar54;
                      sVar78 = auVar82._8_2_;
                      uVar71 = (ushort)((short)uVar71 < sVar78) * sVar78 |
                               ((short)uVar71 >= sVar78) * uVar71;
                      sVar78 = auVar82._10_2_;
                      uVar55 = (ushort)((short)uVar55 < sVar78) * sVar78 |
                               ((short)uVar55 >= sVar78) * uVar55;
                      sVar78 = auVar82._12_2_;
                      uVar56 = (ushort)((short)uVar56 < sVar78) * sVar78 |
                               ((short)uVar56 >= sVar78) * uVar56;
                      sVar78 = auVar82._14_2_;
                      uVar72 = (ushort)((short)uVar72 < sVar78) * sVar78 |
                               ((short)uVar72 >= sVar78) * uVar72;
                      sVar78 = auVar103._0_2_;
                      sVar31 = auVar47._0_2_;
                      uVar98 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._2_2_;
                      sVar31 = auVar47._2_2_;
                      uVar73 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._4_2_;
                      sVar31 = auVar47._4_2_;
                      uVar74 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._6_2_;
                      sVar31 = auVar47._6_2_;
                      uVar99 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._8_2_;
                      sVar31 = auVar47._8_2_;
                      uVar75 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._10_2_;
                      sVar31 = auVar47._10_2_;
                      uVar100 = (ushort)(sVar31 < sVar78) * sVar78 |
                                (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._12_2_;
                      sVar31 = auVar47._12_2_;
                      sVar40 = auVar47._14_2_;
                      uVar76 = (ushort)(sVar31 < sVar78) * sVar78 |
                               (ushort)(sVar31 >= sVar78) * sVar31;
                      sVar78 = auVar103._14_2_;
                      uVar101 = (ushort)(sVar40 < sVar78) * sVar78 |
                                (ushort)(sVar40 >= sVar78) * sVar40;
                      local_158._0_2_ =
                           ((short)uVar98 < (short)uVar65) * uVar65 |
                           ((short)uVar98 >= (short)uVar65) * uVar98;
                      local_158._2_2_ =
                           ((short)uVar73 < (short)uVar53) * uVar53 |
                           ((short)uVar73 >= (short)uVar53) * uVar73;
                      local_158._4_2_ =
                           ((short)uVar74 < (short)uVar70) * uVar70 |
                           ((short)uVar74 >= (short)uVar70) * uVar74;
                      local_158._6_2_ =
                           ((short)uVar99 < (short)uVar54) * uVar54 |
                           ((short)uVar99 >= (short)uVar54) * uVar99;
                      local_158._8_2_ =
                           ((short)uVar75 < (short)uVar71) * uVar71 |
                           ((short)uVar75 >= (short)uVar71) * uVar75;
                      local_158._10_2_ =
                           ((short)uVar100 < (short)uVar55) * uVar55 |
                           ((short)uVar100 >= (short)uVar55) * uVar100;
                      local_158._12_2_ =
                           ((short)uVar76 < (short)uVar56) * uVar56 |
                           ((short)uVar76 >= (short)uVar56) * uVar76;
                      local_158._14_2_ =
                           ((short)uVar101 < (short)uVar72) * uVar72 |
                           ((short)uVar101 >= (short)uVar72) * uVar101;
                      auVar117._4_4_ = uVar32;
                      auVar117._0_4_ = uVar32;
                      auVar117._8_4_ = uVar32;
                      auVar117._12_4_ = uVar32;
                      auVar58 = psubsw(auVar49,auVar117);
                      auVar9._4_4_ = uVar33;
                      auVar9._0_4_ = uVar33;
                      auVar9._8_4_ = uVar33;
                      auVar9._12_4_ = uVar33;
                      auVar108 = psubsw(auVar108,auVar9);
                      auVar50._0_2_ = -(ushort)(auVar108._0_2_ < auVar58._0_2_);
                      auVar50._2_2_ = -(ushort)(auVar108._2_2_ < auVar58._2_2_);
                      auVar50._4_2_ = -(ushort)(auVar108._4_2_ < auVar58._4_2_);
                      auVar50._6_2_ = -(ushort)(auVar108._6_2_ < auVar58._6_2_);
                      auVar50._8_2_ = -(ushort)(auVar108._8_2_ < auVar58._8_2_);
                      auVar50._10_2_ = -(ushort)(auVar108._10_2_ < auVar58._10_2_);
                      auVar50._12_2_ = -(ushort)(auVar108._12_2_ < auVar58._12_2_);
                      auVar50._14_2_ = -(ushort)(auVar108._14_2_ < auVar58._14_2_);
                      if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar50._14_2_ >> 7) & 1) << 0xe |
                                  auVar50._14_2_ & 0x8000) == 0xffff) goto LAB_006e3014;
                      local_168 = pblendvb(local_168,auVar82,auVar50);
                      local_178 = pblendvb(local_178,auVar47,auVar50);
                      auVar58 = pmovsxbw(auVar50,0x101010101010101);
                      auVar82 = paddsw(local_128,auVar58);
                      auVar58 = paddsw(auVar103,auVar58);
                      local_128 = pblendvb(auVar82,auVar58,auVar50);
                      auVar61 = *(undefined1 (*) [16])((long)*ptr + lVar21);
                    }
                  }
LAB_006e3014:
                  alVar68 = ptr_04[uVar34];
                  alVar63 = ptr_00[uVar34];
                  alVar51 = palVar15[uVar34];
                  alVar38 = ptr_01[uVar34];
                  iVar22 = 0;
                  while( true ) {
                    uVar66 = alVar68[0];
                    lVar29 = alVar68[1];
                    uVar57 = alVar63[0];
                    lVar26 = alVar63[1];
                    uVar102 = alVar51[0];
                    lVar25 = alVar51[1];
                    uVar81 = alVar38[0];
                    lVar21 = alVar38[1];
                    if (iVar11 <= iVar22) break;
                    alVar68[0] = uVar66 << 0x10;
                    alVar68[1] = lVar29 << 0x10 | uVar66 >> 0x30;
                    alVar63[0] = uVar57 << 0x10;
                    alVar63[1] = lVar26 << 0x10 | uVar57 >> 0x30;
                    alVar51[0] = uVar102 << 0x10;
                    alVar51[1] = lVar25 << 0x10 | uVar102 >> 0x30;
                    alVar38[0] = uVar81 << 0x10;
                    alVar38[1] = lVar21 << 0x10 | uVar81 >> 0x30;
                    iVar22 = iVar22 + 1;
                  }
                  *(int *)(*((ppVar12->field_4).trace)->trace_del_table + uVar23 * 4) =
                       (int)alVar68[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 8) +
                          uVar23 * 4) = (int)alVar63[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x10) +
                          uVar23 * 4) = (int)alVar51[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x18) +
                          uVar23 * 4) = (int)alVar38[1]._6_2_;
                  uVar23 = uVar23 + 1;
                  palVar13 = ptr;
                  palVar14 = b_00;
                  b = ptr_00;
                  b_00 = palVar15;
                  ptr_00 = ptr_05;
                  palVar15 = ptr_01;
                  ptr_01 = ptr_06;
                  ptr = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_rowcol_striped_profile_sse41_128_16",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}